

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackInterpreter::activateMethodFrame(StackInterpreter *this,CompiledMethod *newMethod)

{
  StackMemory *this_00;
  CompiledMethodHeader *pCVar1;
  size_t sVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar3;
  uint8_t *puVar4;
  uintptr_t value;
  anon_union_8_4_0eb573b0_for_Oop_0 local_60;
  anon_union_8_4_0eb573b0_for_Oop_0 local_58;
  size_t i;
  anon_union_8_4_0eb573b0_for_Oop_0 local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  Oop receiver;
  size_t numTemporals;
  size_t numArguments;
  CompiledMethodHeader header;
  CompiledMethod *newMethod_local;
  StackInterpreter *this_local;
  
  header.oop.field_0 = (Oop)(Oop)newMethod;
  pCVar1 = CompiledMethod::getHeader(newMethod);
  numArguments = (pCVar1->oop).field_0.uintValue;
  sVar2 = CompiledMethodHeader::getArgumentCount((CompiledMethodHeader *)&numArguments);
  receiver.field_0 =
       (anon_union_8_4_0eb573b0_for_Oop_0)
       CompiledMethodHeader::getTemporalCount((CompiledMethodHeader *)&numArguments);
  paVar3 = &stackOopAtOffset(this,(sVar2 + 1) * 8)->field_0;
  local_38 = *paVar3;
  puVar4 = StackMemory::getFramePointer(this->stack);
  pushPointer(this,puVar4);
  this_00 = this->stack;
  puVar4 = StackMemory::getStackPointer(this->stack);
  StackMemory::setFramePointer(this_00,puVar4);
  local_40 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer((void *)header.oop.field_0);
  pushOop(this,(Oop)local_40);
  this->method = (CompiledMethod *)header.oop.field_0;
  value = encodeFrameMetaData(false,false,sVar2);
  pushUInt(this,value);
  Oop::Oop((Oop *)&local_48);
  pushOop(this,(Oop)local_48);
  i = local_38.uintValue;
  pushOop(this,(Oop)local_38);
  for (local_58.pointer = (uint8_t *)0x0; local_58.pointer < (ulong)receiver.field_0;
      local_58.pointer = (uint8_t *)(local_58.uintValue + 1)) {
    Oop::Oop((Oop *)&local_60);
    pushOop(this,(Oop)local_60);
  }
  garbageCollectionSafePoint(this);
  fetchFrameData(this);
  sVar2 = CompiledMethod::getFirstPCOffset((CompiledMethod *)header.oop.field_0);
  this->pc = sVar2;
  checkStackOverflow(this);
  fetchNextInstructionOpcode(this);
  return;
}

Assistant:

void StackInterpreter::activateMethodFrame(CompiledMethod *newMethod)
{
	// Get the method header
	auto header = *newMethod->getHeader();
	auto numArguments = header.getArgumentCount();
	auto numTemporals = header.getTemporalCount();

	// Get the receiver
	auto receiver = stackOopAtOffset((1 + numArguments)*sizeof(Oop));

	// Push the frame pointer.
	pushPointer(stack->getFramePointer()); // Return frame pointer.

	// Set the new frame pointer.
	stack->setFramePointer(stack->getStackPointer());

	// Push the method object.
	pushOop(Oop::fromPointer(newMethod));
	this->method = newMethod;

	// Encode frame metadata
	pushUInt(encodeFrameMetaData(false, false, numArguments));

	// Push the nil this context.
	pushOop(Oop());

	// Push the receiver oop.
	pushOop(receiver);

	// Push the nil temporals.
	for(size_t i = 0; i < numTemporals; ++i)
		pushOop(Oop());

    // Safe point for GC.
    garbageCollectionSafePoint();

	// Fetch the frame data.
	fetchFrameData();

	// Set the instruction pointer.
	pc = newMethod->getFirstPCOffset();

    // Check for stack overflow.
    checkStackOverflow();

	// Fetch the first instruction opcode
	fetchNextInstructionOpcode();
}